

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

void __thiscall Importer_addModelToLibrary_Test::TestBody(Importer_addModelToLibrary_Test *this)

{
  shared_ptr *psVar1;
  undefined1 uVar2;
  char cVar3;
  char *pcVar4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ModelPtr sourceModel;
  ImporterPtr importer;
  ModelPtr model;
  ParserPtr parser;
  long *local_a8;
  long *local_a0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  AssertionResult local_90;
  long local_80 [2];
  AssertHelper local_70 [8];
  shared_ptr *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  shared_ptr *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  long local_48 [2];
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_58 = (shared_ptr *)local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"importer/generic_no_source.cellml","");
  fileContents((string *)&local_90);
  libcellml::Parser::parseModel(local_38);
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  if (local_58 != (shared_ptr *)local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  libcellml::Importer::create(SUB81(&local_58,0));
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"source","");
  libcellml::Model::create((string *)&local_68);
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  psVar1 = local_68;
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"a","");
  libcellml::Component::create((string *)&local_a0);
  libcellml::ComponentEntity::addComponent(psVar1);
  if (local_98.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.ptr_);
  }
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  psVar1 = local_68;
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"b","");
  libcellml::Component::create((string *)&local_a0);
  libcellml::ComponentEntity::addComponent(psVar1);
  if (local_98.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.ptr_);
  }
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  psVar1 = local_68;
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"c","");
  libcellml::Component::create((string *)&local_a0);
  libcellml::ComponentEntity::addComponent(psVar1);
  if (local_98.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.ptr_);
  }
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"d","");
  libcellml::Component::create((string *)&local_a0);
  libcellml::ComponentEntity::addComponent(local_68);
  if (local_98.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.ptr_);
  }
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  psVar1 = local_58;
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"i_dont_exist.cellml","");
  uVar2 = libcellml::Importer::addModel(psVar1,(string *)&local_68);
  local_a0 = (long *)CONCAT71(local_a0._1_7_,uVar2);
  local_98.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  if (local_a0._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(char *)&local_a0,
               "importer->addModel(sourceModel, \"i_dont_exist.cellml\")","false");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x17d,(char *)local_90._0_8_);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    if ((long *)local_90._0_8_ != local_80) {
      operator_delete((void *)local_90._0_8_,local_80[0] + 1);
    }
    if (local_a8 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_58;
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"i_dont_exist.cellml","");
  uVar2 = libcellml::Importer::addModel(psVar1,(string *)&local_68);
  local_a0 = (long *)(CONCAT71(local_a0._1_7_,uVar2) ^ 1);
  local_98.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  if (local_a0._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(char *)&local_a0,
               "importer->addModel(sourceModel, \"i_dont_exist.cellml\")","true");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x180,(char *)local_90._0_8_);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    if ((long *)local_90._0_8_ != local_80) {
      operator_delete((void *)local_90._0_8_,local_80[0] + 1);
    }
    if (local_a8 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_58;
  pcVar4 = "";
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"","");
  libcellml::Importer::resolveImports(psVar1,local_38);
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  local_a0 = (long *)0x0;
  local_a8 = (long *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_90,"size_t(0)","importer->issueCount()",(unsigned_long *)&local_a0,
             (unsigned_long *)&local_a8);
  if ((string)local_90.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_90.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = ((local_90.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x184,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_a0 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_a0 != (long *)0x0)) {
        (**(code **)(*local_a0 + 8))();
      }
      local_a0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar3 = libcellml::Model::hasUnresolvedImports();
  local_a0 = (long *)(CONCAT71(local_a0._1_7_,cVar3) ^ 1);
  local_98.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(char *)&local_a0,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x185,(char *)local_90._0_8_);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    if ((long *)local_90._0_8_ != local_80) {
      operator_delete((void *)local_90._0_8_,local_80[0] + 1);
    }
    if (local_a8 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Importer, addModelToLibrary)
{
    // This test shows how a model instance can be manually added to the import library by the user,
    // and will be used to resolve imports, rather than from an external file/URL.
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/generic_no_source.cellml"));
    auto importer = libcellml::Importer::create();

    auto sourceModel = libcellml::Model::create("source");
    sourceModel->addComponent(libcellml::Component::create("a"));
    sourceModel->addComponent(libcellml::Component::create("b"));
    sourceModel->addComponent(libcellml::Component::create("c"));
    sourceModel->addComponent(libcellml::Component::create("d"));

    // Add a model manually to the library, including the URL that it will replace in future imports.
    EXPECT_TRUE(importer->addModel(sourceModel, "i_dont_exist.cellml"));

    // Can't add to the same URL key more than once.
    EXPECT_FALSE(importer->addModel(sourceModel, "i_dont_exist.cellml"));

    importer->resolveImports(model, "");

    EXPECT_EQ(size_t(0), importer->issueCount());
    EXPECT_FALSE(model->hasUnresolvedImports());
}